

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SSTable.cpp
# Opt level: O0

istream * operator>>(istream *is,SSTableDataEntry *s)

{
  SSTableDataEntry *s_local;
  istream *is_local;
  
  bytes_read<bool>(is,&s->delete_flag,0);
  bytes_read<long>(is,&s->timestamp,0);
  bytes_read<long_long>(is,&s->key,0);
  bytes_read<unsigned_long>(is,&s->value_length,0);
  bytes_read<std::__cxx11::string>(is,&s->value,s->value_length);
  return is;
}

Assistant:

std::istream &operator>>(std::istream &is, SSTableDataEntry &s) {
    bytes_read(is, &s.delete_flag);
    bytes_read(is, &s.timestamp);
    bytes_read(is, &s.key);
    bytes_read(is, &s.value_length);
    bytes_read(is, &s.value, s.value_length);
    return is;
}